

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.cpp
# Opt level: O3

shared_ptr<gui::TextBox> __thiscall
gui::TextBox::create(TextBox *this,shared_ptr<gui::TextBoxStyle> *style,String *name)

{
  TextBox *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<gui::TextBox> sVar2;
  shared_ptr<gui::TextBoxStyle> local_38;
  
  this_00 = (TextBox *)operator_new(0x3a8);
  local_38.super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (style->super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38.super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (style->super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_38.super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_38.super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_38.super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  TextBox(this_00,&local_38,name);
  std::__shared_ptr<gui::TextBox,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<gui::TextBox,void>
            ((__shared_ptr<gui::TextBox,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  _Var1._M_pi = extraout_RDX;
  if (local_38.super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<gui::TextBox,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi
  ;
  sVar2.super___shared_ptr<gui::TextBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<gui::TextBox>)
         sVar2.super___shared_ptr<gui::TextBox,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TextBox> TextBox::create(std::shared_ptr<TextBoxStyle> style, const sf::String& name) {
    return std::shared_ptr<TextBox>(new TextBox(style, name));
}